

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::detail::
iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::set_end(iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          *this)

{
  pointer pbVar1;
  
  pbVar1 = this->m_object;
  if (pbVar1 == (pointer)0x0) {
    __assert_fail("m_object != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                  ,0x1303,
                  "void nlohmann::detail::iter_impl<const nlohmann::basic_json<>>::set_end() [BasicJsonType = const nlohmann::basic_json<>]"
                 );
  }
  if (pbVar1->m_type != array) {
    if (pbVar1->m_type == object) {
      (this->m_it).object_iterator._M_node =
           &(((pbVar1->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
      return;
    }
    (this->m_it).primitive_iterator.m_it = 1;
    return;
  }
  (this->m_it).array_iterator._M_current =
       (((pbVar1->m_value).array)->
       super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  return;
}

Assistant:

void set_end() noexcept {
		assert(m_object != nullptr);

		switch (m_object->m_type) {
			case value_t::object: {
				m_it.object_iterator = m_object->m_value.object->end();
				break;
			}

			case value_t::array: {
				m_it.array_iterator = m_object->m_value.array->end();
				break;
			}

			default: {
				m_it.primitive_iterator.set_end();
				break;
			}
		}
	}